

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O0

TRef lj_opt_narrow_mod(jit_State *J,TRef rb,TRef rc,TValue *vb,TValue *vc)

{
  TRef TVar1;
  TRef TVar2;
  TRef TVar3;
  jit_State *in_RCX;
  long in_RDI;
  jit_State *in_R8;
  TRef tmp;
  undefined8 in_stack_ffffffffffffff68;
  long lVar4;
  undefined2 in_stack_ffffffffffffff70;
  undefined2 in_stack_ffffffffffffff72;
  undefined2 uVar5;
  undefined4 in_stack_ffffffffffffff74;
  TRef local_64;
  
  TVar3 = (TRef)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  TVar1 = conv_str_tonum((jit_State *)
                         CONCAT44(in_stack_ffffffffffffff74,
                                  CONCAT22(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70)),
                         TVar3,(TValue *)0x19d751);
  TVar2 = conv_str_tonum((jit_State *)
                         CONCAT44(in_stack_ffffffffffffff74,
                                  CONCAT22(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70)),
                         TVar3,(TValue *)0x19d768);
  if (((((*(uint *)(in_RDI + 0x90) & 0x200000) == 0) || (4 < (TVar1 >> 0x18 & 0x1f) - 0xf)) ||
      (4 < (TVar2 >> 0x18 & 0x1f) - 0xf)) ||
     (((undefined1  [96])in_R8->cur & (undefined1  [96])0x7fffffffffffffff) == (undefined1  [96])0x0
     )) {
    TVar1 = lj_ir_tonum((jit_State *)
                        CONCAT44(in_stack_ffffffffffffff74,
                                 CONCAT22(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70)),
                        TVar3);
    TVar2 = lj_ir_tonum((jit_State *)
                        CONCAT44(in_stack_ffffffffffffff74,
                                 CONCAT22(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70)),
                        TVar3);
    *(undefined2 *)(in_RDI + 0xa4) = 0x2c0e;
    *(short *)(in_RDI + 0xa0) = (short)TVar1;
    *(short *)(in_RDI + 0xa2) = (short)TVar2;
    TVar3 = lj_opt_fold(in_R8);
    *(undefined2 *)(in_RDI + 0xa4) = 0x340e;
    *(short *)(in_RDI + 0xa0) = (short)TVar3;
    *(undefined2 *)(in_RDI + 0xa2) = 0;
    TVar3 = lj_opt_fold(in_R8);
    *(undefined2 *)(in_RDI + 0xa4) = 0x2b0e;
    *(short *)(in_RDI + 0xa0) = (short)TVar3;
    *(short *)(in_RDI + 0xa2) = (short)TVar2;
    TVar2 = lj_opt_fold(in_R8);
    *(undefined2 *)(in_RDI + 0xa4) = 0x2a0e;
    *(short *)(in_RDI + 0xa0) = (short)TVar1;
    *(short *)(in_RDI + 0xa2) = (short)TVar2;
    local_64 = lj_opt_fold(in_R8);
  }
  else {
    lVar4 = in_RDI;
    uVar5 = (short)TVar2;
    TVar3 = lj_ir_kint(in_RCX,(int32_t)((ulong)in_R8 >> 0x20));
    *(undefined2 *)(lVar4 + 0xa4) = 0x993;
    *(undefined2 *)(lVar4 + 0xa0) = uVar5;
    *(short *)(lVar4 + 0xa2) = (short)TVar3;
    lj_opt_fold(in_R8);
    *(undefined2 *)(in_RDI + 0xa4) = 0x2d13;
    *(short *)(in_RDI + 0xa0) = (short)TVar1;
    *(short *)(in_RDI + 0xa2) = (short)TVar2;
    local_64 = lj_opt_fold(in_R8);
  }
  return local_64;
}

Assistant:

TRef lj_opt_narrow_mod(jit_State *J, TRef rb, TRef rc, TValue *vb, TValue *vc)
{
  TRef tmp;
  rb = conv_str_tonum(J, rb, vb);
  rc = conv_str_tonum(J, rc, vc);
  if ((LJ_DUALNUM || (J->flags & JIT_F_OPT_NARROW)) &&
      tref_isinteger(rb) && tref_isinteger(rc) &&
      (tvisint(vc) ? intV(vc) != 0 : !tviszero(vc))) {
    emitir(IRTGI(IR_NE), rc, lj_ir_kint(J, 0));
    return emitir(IRTI(IR_MOD), rb, rc);
  }
  /* b % c ==> b - floor(b/c)*c */
  rb = lj_ir_tonum(J, rb);
  rc = lj_ir_tonum(J, rc);
  tmp = emitir(IRTN(IR_DIV), rb, rc);
  tmp = emitir(IRTN(IR_FPMATH), tmp, IRFPM_FLOOR);
  tmp = emitir(IRTN(IR_MUL), tmp, rc);
  return emitir(IRTN(IR_SUB), rb, tmp);
}